

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded_opt.hpp
# Opt level: O3

handle * __thiscall
gmlc::libguarded::guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>
::lock(handle *__return_storage_ptr__,
      guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *this)

{
  bool bVar1;
  unique_lock<std::mutex> local_18;
  
  bVar1 = this->enabled;
  __return_storage_ptr__->data = &this->m_obj;
  if (bVar1 == true) {
    (__return_storage_ptr__->m_handle_lock)._M_device = &this->m_mutex;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    std::unique_lock<std::mutex>::lock(&__return_storage_ptr__->m_handle_lock);
    (__return_storage_ptr__->m_handle_lock)._M_owns = true;
  }
  else {
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_18._M_device = (mutex_type *)0x0;
    local_18._M_owns = false;
    std::unique_lock<std::mutex>::~unique_lock(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

auto guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}